

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O3

void tf::throw_re<char_const(&)[36]>(char *fname,size_t line,char (*args) [36])

{
  ostream *poVar1;
  size_t sVar2;
  runtime_error *this;
  ostringstream oss;
  undefined1 auStack_1c8 [8];
  string local_1c0 [32];
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,"[",1);
  if (fname == (char *)0x0) {
    std::ios::clear((int)(auStack_1c8 + (long)local_1a0._vptr_basic_ostream[-3]) + 0x28);
  }
  else {
    sVar2 = strlen(fname);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,fname,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,":",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
  sVar2 = strlen(*args);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,*args,sVar2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1c0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_re(const char* fname, const size_t line, ArgsT&&... args) {
  std::ostringstream oss;
  oss << "[" << fname << ":" << line << "] ";
  //ostreamize(oss, std::forward<ArgsT>(args)...);
  (oss << ... << args);
  throw std::runtime_error(oss.str());
}